

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::precise::equations::convert_equnit_to_value(double val,unit_data *UT)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double local_78;
  double local_60;
  double local_48;
  double out_1;
  double out;
  int logtype;
  unit_data *UT_local;
  double val_local;
  
  bVar2 = detail::unit_data::is_equation(UT);
  val_local = val;
  if (bVar2) {
    iVar3 = custom::eq_type(UT);
    switch(iVar3) {
    case 0:
    case 10:
      val_local = ::pow(10.0,val);
      break;
    case 1:
      bVar2 = is_power_unit(UT);
      local_48 = 0.5;
      if (!bVar2) {
        local_48 = 1.0;
      }
      val_local = exp(val / local_48);
      break;
    case 2:
      bVar2 = is_power_unit(UT);
      local_60 = 1.0;
      if (!bVar2) {
        local_60 = 2.0;
      }
      val_local = ::pow(10.0,val / local_60);
      break;
    case 3:
      bVar2 = is_power_unit(UT);
      local_78 = 10.0;
      if (!bVar2) {
        local_78 = 20.0;
      }
      val_local = ::pow(10.0,val / local_78);
      break;
    case 4:
      val_local = ::pow(10.0,-val);
      break;
    case 5:
      val_local = ::pow(100.0,-val);
      break;
    case 6:
      val_local = ::pow(1000.0,-val);
      break;
    case 7:
      val_local = ::pow(50000.0,-val);
      break;
    case 8:
      val_local = exp2(val);
      break;
    case 9:
      val_local = exp(val);
      break;
    case 0xb:
      val_local = ::pow(10.0,val / 10.0);
      break;
    case 0xc:
      val_local = ::pow(10.0,val / 2.0);
      break;
    case 0xd:
      val_local = ::pow(10.0,val / 20.0);
      break;
    case 0xe:
      val_local = ::pow(3.0,val);
      break;
    case 0xf:
      val_local = exp(val / 0.5);
      break;
    case 0x10:
      val_local = 141.5 / (val + 131.5);
      break;
    case 0x11:
      val_local = 140.0 / (val + 130.0);
      break;
    case 0x12:
      val_local = 145.0 / (145.0 - val);
      break;
    default:
      break;
    case 0x16:
      dVar1 = fma(-0.17613636364,val,2.8851010101);
      dVar1 = fma(dVar1,val,-14.95265151515);
      dVar1 = fma(dVar1,val,47.85191197691);
      val_local = fma(dVar1,val,38.90151515152);
      break;
    case 0x17:
      dVar1 = fma(0.00177396133,val,-0.05860071301);
      dVar1 = fma(dVar1,val,0.93621452077);
      dVar1 = fma(dVar1,val,0.2424609704);
      val_local = fma(dVar1,val,-0.12475759535);
      break;
    case 0x18:
      dVar1 = ::pow(val + 2.0,1.5);
      val_local = dVar1 * 14.1;
      break;
    case 0x1b:
      val_local = atan(val / 100.0);
      break;
    case 0x1d:
      val_local = ::pow(10.0,(val + 10.7) * 1.5);
      break;
    case 0x1e:
      val_local = ::pow(10.0,(val + 3.2) * 1.5);
    }
  }
  return val_local;
}

Assistant:

inline double
            convert_equnit_to_value(double val, const detail::unit_data& UT)
        {
            if (!UT.is_equation()) {
                return val;
            }
            int logtype = custom::eq_type(UT);
            switch (logtype) {
                case 0:
                case 10:
                    return std::pow(10.0, val);
                case 1:
                    return std::exp(val / ((is_power_unit(UT)) ? 0.5 : 1.0));
                case 2:
                    return std::pow(
                        10.0, val / ((is_power_unit(UT)) ? 1.0 : 2.0));
                case 3:
                    return std::pow(
                        10.0, val / ((is_power_unit(UT)) ? 10.0 : 20.0));
                case 4:
                    return std::pow(10.0, -val);
                case 5:
                    return std::pow(100.0, -val);
                case 6:
                    return std::pow(1000.0, -val);
                case 7:
                    return std::pow(50000.0, -val);
                case 8:
                    return std::exp2(val);
                case 9:
                    return std::exp(val);
                case 11:
                    return std::pow(10.0, val / 10.0);
                case 12:
                    return std::pow(10.0, val / 2.0);
                case 13:
                    return std::pow(10.0, val / 20.0);
                case 14:
                    return std::pow(3.0, val);
                case 15:
                    return std::exp(val / 0.5);
                case 16:  // API Gravity
                    return 141.5 / (val + 131.5);
                case 17:  // degrees Baume Light
                    return 140.0 / (130.0 + val);
                case 18:  // degrees Baume Heavy
                    return 145.0 / (145.0 - val);
                case 22:  // saffir simpson hurricane wind scale
                {
                    double out = -0.17613636364;
                    out = std::fma(out, val, 2.88510101010);
                    out = std::fma(out, val, -14.95265151515);
                    out = std::fma(out, val, 47.85191197691);
                    out = std::fma(out, val, 38.90151515152);
                    return out;
                }
                case 23: {  // Beaufort wind scale
                    double out = 0.00177396133;
                    out = std::fma(out, val, -0.05860071301);
                    out = std::fma(out, val, 0.93621452077);
                    out = std::fma(out, val, 0.24246097040);
                    out = std::fma(out, val, -0.12475759535);
                    return out;
                }
                case 24:  // Fujita scale
                    return 14.1 * std::pow(val + 2.0, 1.5);
                case 27:  // prism diopter
                    return std::atan(val / 100.0);
                case 29:  // moment magnitude scale
                    return std::pow(10.0, (val + 10.7) * 1.5);
                case 30:
                    return std::pow(10.0, (val + 3.2) * 1.5);
                default:
                    return val;
            }
        }